

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O2

void encode_bc7_block(void *pBlock,bc7_optimization_results *pResults)

{
  uint8_t uVar1;
  undefined4 uVar2;
  char cVar3;
  uint8_t *puVar4;
  byte bVar5;
  uint32_t i;
  byte *pbVar6;
  long lVar7;
  uint32_t uVar8;
  uint uVar9;
  color_quad_u8 *pcVar10;
  uint32_t comp;
  uint32_t subset;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t *puVar14;
  color_quad_u8 *pcVar15;
  uint32_t k;
  ulong uVar16;
  ulong uVar17;
  uint8_t *puVar18;
  ulong uVar19;
  uint32_t auVar20 [2];
  uint32_t cur_bit_ofs;
  ulong local_e8;
  ulong local_e0;
  uint local_d4;
  uint8_t *local_d0;
  ulong local_c8;
  bc7_optimization_results *local_c0;
  ulong local_b8;
  uint local_b0;
  color_quad_u8 high [3];
  color_quad_u8 low [3];
  uint8_t alpha_selectors [16];
  uint8_t color_selectors [16];
  ulong local_60;
  uint32_t pbits [3] [2];
  
  uVar9 = pResults->m_mode;
  local_e8 = (ulong)uVar9;
  local_d0 = (uint8_t *)(ulong)"\x03\x02\x03\x02\x01\x01\x01\x02"[local_e8];
  uVar12 = local_e8 - 4;
  if (uVar12 < 3) {
    puVar4 = "";
  }
  else {
    if ((0x8aUL >> (local_e8 & 0x3f) & 1) == 0) {
      puVar4 = "";
    }
    else {
      puVar4 = "";
    }
    puVar4 = puVar4 + (pResults->m_partition << 4);
  }
  local_e0 = (ulong)(int)uVar9;
  color_selectors._0_8_ = *(undefined8 *)pResults->m_selectors;
  color_selectors._8_8_ = *(undefined8 *)(pResults->m_selectors + 8);
  alpha_selectors._0_8_ = *(undefined8 *)pResults->m_alpha_selectors;
  alpha_selectors._8_8_ = *(undefined8 *)(pResults->m_alpha_selectors + 8);
  pcVar10 = low;
  low._0_8_ = *(undefined8 *)pResults->m_low;
  low[2].m_c = *&pResults->m_low[2].m_c;
  pcVar15 = high;
  high._0_8_ = *(undefined8 *)pResults->m_high;
  high[2].m_c = *&pResults->m_high[2].m_c;
  pbits[2] = pResults->m_pbits[2];
  pbits[0] = pResults->m_pbits[0];
  pbits[1] = pResults->m_pbits[1];
  local_b0 = 0xffffffff;
  local_b8 = 0xffffffffffffffff;
  local_d4 = uVar9 & 0xfffffffe;
  uVar16 = 0;
  do {
    if ((uint8_t *)uVar16 == local_d0) {
      *(undefined1 (*) [16])pBlock = (undefined1  [16])0x0;
      cur_bit_ofs = 0;
      local_c0 = pResults;
      set_block_bits((uint8_t *)pBlock,1 << ((byte)uVar9 & 0x1f),uVar9 + 1,&cur_bit_ofs);
      if (local_d4 == 4) {
        set_block_bits((uint8_t *)pBlock,pResults->m_rotation,2,&cur_bit_ofs);
        if ((int)local_e8 == 4) {
          set_block_bits((uint8_t *)pBlock,pResults->m_index_selector,1,&cur_bit_ofs);
        }
      }
      uVar16 = local_e8;
      if (2 < uVar12) {
        set_block_bits((uint8_t *)pBlock,pResults->m_partition,
                       (uint)((0x8eUL >> (local_e8 & 0x3f) & 1) != 0) * 2 + 4,&cur_bit_ofs);
      }
      local_c8 = 4 - (ulong)((uint)uVar16 < 4);
      puVar4 = low[0].m_c;
      puVar18 = high[0].m_c;
      for (lVar7 = 0; uVar12 = local_e0, lVar7 != local_c8; lVar7 = lVar7 + 1) {
        for (uVar12 = 0; local_d0 != (uint8_t *)uVar12; uVar12 = uVar12 + 1) {
          if (lVar7 == 3) {
            uVar8 = (uint32_t)""[local_e8];
          }
          else {
            uVar8 = (uint32_t)"\x04\x06\x05\a\x05\a\a\x05"[local_e8];
          }
          set_block_bits((uint8_t *)pBlock,(uint)puVar4[uVar12 * 4],uVar8,&cur_bit_ofs);
          if (lVar7 == 3) {
            uVar8 = (uint32_t)""[local_e8];
          }
          else {
            uVar8 = (uint32_t)"\x04\x06\x05\a\x05\a\a\x05"[local_e8];
          }
          set_block_bits((uint8_t *)pBlock,(uint)puVar18[uVar12 * 4],uVar8,&cur_bit_ofs);
        }
        puVar4 = puVar4 + 1;
        puVar18 = puVar18 + 1;
      }
      if ((0x34UL >> (local_e8 & 0x3f) & 1) == 0) {
        for (uVar16 = 0; local_d0 != (uint8_t *)uVar16; uVar16 = uVar16 + 1) {
          set_block_bits((uint8_t *)pBlock,pbits[uVar16][0],1,&cur_bit_ofs);
          if ((int)uVar12 != 1) {
            set_block_bits((uint8_t *)pBlock,pbits[uVar16][1],1,&cur_bit_ofs);
          }
        }
      }
      uVar19 = local_b8 & 0xffffffff;
      uVar12 = local_b8 >> 0x20;
      local_60 = (ulong)local_b0;
      local_d0 = alpha_selectors;
      puVar4 = color_selectors;
      uVar16 = uVar19;
      uVar17 = local_60;
      local_c8 = uVar12;
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        for (uVar13 = 0; uVar13 != 4; uVar13 = uVar13 + 1) {
          uVar8 = local_c0->m_index_selector;
          if (uVar8 == 0) {
            uVar9 = (uint)"\x03\x03\x02\x02\x02\x02\x04\x02"[local_e0];
          }
          else {
            uVar9 = ""[local_e0] - uVar8;
          }
          puVar18 = puVar4;
          if (uVar8 != 0) {
            puVar18 = local_d0;
          }
          set_block_bits((uint8_t *)pBlock,(uint)puVar18[uVar13],
                         uVar9 - ((uVar16 == uVar13 || uVar12 == uVar13) || uVar17 == uVar13),
                         &cur_bit_ofs);
        }
        uVar17 = uVar17 - 4;
        uVar12 = uVar12 - 4;
        uVar16 = uVar16 - 4;
        local_d0 = local_d0 + 4;
        puVar4 = puVar4 + 4;
      }
      if (local_d4 == 4) {
        puVar18 = color_selectors;
        puVar4 = alpha_selectors;
        for (local_e0 = 0; local_e0 != 4; local_e0 = local_e0 + 1) {
          for (uVar12 = 0; uVar12 != 4; uVar12 = uVar12 + 1) {
            uVar8 = local_c0->m_index_selector;
            if (uVar8 == 0) {
              uVar9 = (uint)""[local_e8];
            }
            else {
              uVar9 = "\x03\x03\x02\x02\x02\x02\x04\x02"[local_e8] + uVar8;
            }
            puVar14 = puVar4;
            if (uVar8 != 0) {
              puVar14 = puVar18;
            }
            set_block_bits((uint8_t *)pBlock,(uint)puVar14[uVar12],
                           uVar9 - ((uVar19 == uVar12 || local_c8 == uVar12) || local_60 == uVar12),
                           &cur_bit_ofs);
          }
          local_60 = local_60 - 4;
          local_c8 = local_c8 - 4;
          uVar19 = uVar19 - 4;
          puVar18 = puVar18 + 4;
          puVar4 = puVar4 + 4;
        }
      }
      return;
    }
    if (uVar16 == 0) {
      bVar5 = 0;
    }
    else {
      if (uVar16 == 1 && (local_e0 & 0xfffffffd) == 0) {
        pbVar6 = "\x03\x03\x0f\x0f\b\x03\x0f\x0f\b\b\x06\x06\x06\x05\x03\x03\x03\x03\b\x0f\x03\x03\x06\n\x05\b\b\x06\b\x05\x0f\x0f\b\x0f\x03\x05\x06\n\b\x0f\x0f\x03\x0f\x05\x0f\x0f\x0f\x0f\x03\x0f\x05\x05\x05\b\x05\n\x05\n\b\r\x0f\f\x03\x03"
                 + pResults->m_partition;
      }
      else if (uVar16 == 2 && (local_e0 & 0xfffffffd) == 0) {
        pbVar6 = "\x0f\b\b\x03\x0f\x0f\x03\b\x0f\x0f\x0f\x0f\x0f\x0f\x0f\b\x0f\b\x0f\x03\x0f\b\x0f\b\x03\x0f\x06\n\x0f\x0f\n\b\x0f\x03\x0f\n\n\b\t\n\x06\x0f\b\x0f\x03\x06\x06\b\x0f\x03\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x03\x0f\x0f\b"
                 + pResults->m_partition;
      }
      else {
        pbVar6 = "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x02\b\x02\x02\b\b\x0f\x02\b\x02\x02\b\b\x02\x02\x0f\x0f\x06\b\x02\b\x0f\x0f\x02\b\x02\x02\x02\x0f\x0f\x06\x06\x02\x06\b\x0f\x0f\x02\x02\x0f\x0f\x0f\x0f\x0f\x02\x02\x0f"
                 + pResults->m_partition;
      }
      bVar5 = *pbVar6;
    }
    *(uint *)((long)&local_b8 + uVar16 * 4) = (uint)bVar5;
    cVar3 = (char)pResults->m_index_selector;
    uVar11 = 1 << ("\x03\x03\x02\x02\x02\x02\x04\x02"[local_e0] + cVar3 & 0x1f);
    if ((uVar11 >> 1 & (uint)color_selectors[bVar5]) == 0) {
LAB_001089f1:
      if ((local_d4 == 4) &&
         (uVar11 = 1 << (""[local_e0] - cVar3 & 0x1f),
         (uVar11 >> 1 & (uint)alpha_selectors[bVar5]) != 0)) {
        for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
          if (uVar16 == puVar4[lVar7]) {
            alpha_selectors[lVar7] = ~alpha_selectors[lVar7] + (char)uVar11;
          }
        }
        uVar1 = low[uVar16].m_c[3];
        low[uVar16].m_c[3] = high[uVar16].m_c[3];
        high[uVar16].m_c[3] = uVar1;
      }
    }
    else {
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
        if (uVar16 == puVar4[lVar7]) {
          color_selectors[lVar7] = ~color_selectors[lVar7] + (char)uVar11;
        }
      }
      if (local_d4 == 4) {
        for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
          uVar1 = pcVar10->m_c[lVar7];
          pcVar10->m_c[lVar7] = pcVar15->m_c[lVar7];
          pcVar15->m_c[lVar7] = uVar1;
        }
      }
      else {
        uVar2 = *(undefined4 *)low[uVar16].m_c;
        *(undefined4 *)low[uVar16].m_c = *(undefined4 *)high[uVar16].m_c;
        *(undefined4 *)high[uVar16].m_c = uVar2;
      }
      if (uVar9 != 1) {
        auVar20[1] = SUB84(pbits[uVar16],0);
        auVar20[0] = SUB84(pbits[uVar16],4);
        pbits[uVar16] = auVar20;
        goto LAB_001089f1;
      }
    }
    uVar16 = uVar16 + 1;
    pcVar10 = pcVar10 + 1;
    pcVar15 = pcVar15 + 1;
  } while( true );
}

Assistant:

static void encode_bc7_block(void* pBlock, const bc7_optimization_results* pResults)
{
	assert(pResults->m_index_selector <= 1);
	assert(pResults->m_rotation <= 3);

	const uint32_t best_mode = pResults->m_mode;

	const uint32_t total_subsets = g_bc7_num_subsets[best_mode];
	const uint32_t total_partitions = 1 << g_bc7_partition_bits[best_mode];
	//const uint32_t num_rotations = 1 << g_bc7_rotation_bits[best_mode];
	//const uint32_t num_index_selectors = (best_mode == 4) ? 2 : 1;

	const uint8_t* pPartition;
	if (total_subsets == 1)
		pPartition = &g_bc7_partition1[0];
	else if (total_subsets == 2)
		pPartition = &g_bc7_partition2[pResults->m_partition * 16];
	else
		pPartition = &g_bc7_partition3[pResults->m_partition * 16];

	uint8_t color_selectors[16];
	memcpy(color_selectors, pResults->m_selectors, 16);

	uint8_t alpha_selectors[16];
	memcpy(alpha_selectors, pResults->m_alpha_selectors, 16);

	color_quad_u8 low[3], high[3];
	memcpy(low, pResults->m_low, sizeof(low));
	memcpy(high, pResults->m_high, sizeof(high));

	uint32_t pbits[3][2];
	memcpy(pbits, pResults->m_pbits, sizeof(pbits));

	int anchor[3] = { -1, -1, -1 };

	for (uint32_t k = 0; k < total_subsets; k++)
	{
		uint32_t anchor_index = 0;
		if (k)
		{
			if ((total_subsets == 3) && (k == 1))
				anchor_index = g_bc7_table_anchor_index_third_subset_1[pResults->m_partition];
			else if ((total_subsets == 3) && (k == 2))
				anchor_index = g_bc7_table_anchor_index_third_subset_2[pResults->m_partition];
			else
				anchor_index = g_bc7_table_anchor_index_second_subset[pResults->m_partition];
		}

		anchor[k] = anchor_index;

		const uint32_t color_index_bits = get_bc7_color_index_size(best_mode, pResults->m_index_selector);
		const uint32_t num_color_indices = 1 << color_index_bits;

		if (color_selectors[anchor_index] & (num_color_indices >> 1))
		{
			for (uint32_t i = 0; i < 16; i++)
				if (pPartition[i] == k)
					color_selectors[i] = (uint8_t)((num_color_indices - 1) - color_selectors[i]);

			if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
			{
				for (uint32_t q = 0; q < 3; q++)
				{
					uint8_t t = low[k].m_c[q];
					low[k].m_c[q] = high[k].m_c[q];
					high[k].m_c[q] = t;
				}
			}
			else
			{
				color_quad_u8 tmp = low[k];
				low[k] = high[k];
				high[k] = tmp;
			}

			if (!g_bc7_mode_has_shared_p_bits[best_mode])
			{
				uint32_t t = pbits[k][0];
				pbits[k][0] = pbits[k][1];
				pbits[k][1] = t;
			}
		}

		if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
		{
			const uint32_t alpha_index_bits = get_bc7_alpha_index_size(best_mode, pResults->m_index_selector);
			const uint32_t num_alpha_indices = 1 << alpha_index_bits;

			if (alpha_selectors[anchor_index] & (num_alpha_indices >> 1))
			{
				for (uint32_t i = 0; i < 16; i++)
					if (pPartition[i] == k)
						alpha_selectors[i] = (uint8_t)((num_alpha_indices - 1) - alpha_selectors[i]);

				uint8_t t = low[k].m_c[3];
				low[k].m_c[3] = high[k].m_c[3];
				high[k].m_c[3] = t;
			}
		}
	}

	uint8_t* pBlock_bytes = (uint8_t*)(pBlock);
	memset(pBlock_bytes, 0, BC7ENC_BLOCK_SIZE);

	uint32_t cur_bit_ofs = 0;
	set_block_bits(pBlock_bytes, 1 << best_mode, best_mode + 1, &cur_bit_ofs);

	if ((best_mode == 4) || (best_mode == 5))
		set_block_bits(pBlock_bytes, pResults->m_rotation, 2, &cur_bit_ofs);

	if (best_mode == 4)
		set_block_bits(pBlock_bytes, pResults->m_index_selector, 1, &cur_bit_ofs);

	if (total_partitions > 1)
		set_block_bits(pBlock_bytes, pResults->m_partition, (total_partitions == 64) ? 6 : 4, &cur_bit_ofs);

	const uint32_t total_comps = (best_mode >= 4) ? 4 : 3;
	for (uint32_t comp = 0; comp < total_comps; comp++)
	{
		for (uint32_t subset = 0; subset < total_subsets; subset++)
		{
			set_block_bits(pBlock_bytes, low[subset].m_c[comp], (comp == 3) ? g_bc7_alpha_precision_table[best_mode] : g_bc7_color_precision_table[best_mode], &cur_bit_ofs);
			set_block_bits(pBlock_bytes, high[subset].m_c[comp], (comp == 3) ? g_bc7_alpha_precision_table[best_mode] : g_bc7_color_precision_table[best_mode], &cur_bit_ofs);
		}
	}

	if (g_bc7_mode_has_p_bits[best_mode])
	{
		for (uint32_t subset = 0; subset < total_subsets; subset++)
		{
			set_block_bits(pBlock_bytes, pbits[subset][0], 1, &cur_bit_ofs);
			if (!g_bc7_mode_has_shared_p_bits[best_mode])
				set_block_bits(pBlock_bytes, pbits[subset][1], 1, &cur_bit_ofs);
		}
	}

	for (uint32_t y = 0; y < 4; y++)
	{
		for (uint32_t x = 0; x < 4; x++)
		{
			int idx = x + y * 4;

			uint32_t n = pResults->m_index_selector ? get_bc7_alpha_index_size(best_mode, pResults->m_index_selector) : get_bc7_color_index_size(best_mode, pResults->m_index_selector);

			if ((idx == anchor[0]) || (idx == anchor[1]) || (idx == anchor[2]))
				n--;

			set_block_bits(pBlock_bytes, pResults->m_index_selector ? alpha_selectors[idx] : color_selectors[idx], n, &cur_bit_ofs);
		}
	}

	if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
	{
		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				int idx = x + y * 4;

				uint32_t n = pResults->m_index_selector ? get_bc7_color_index_size(best_mode, pResults->m_index_selector) : get_bc7_alpha_index_size(best_mode, pResults->m_index_selector);

				if ((idx == anchor[0]) || (idx == anchor[1]) || (idx == anchor[2]))
					n--;

				set_block_bits(pBlock_bytes, pResults->m_index_selector ? color_selectors[idx] : alpha_selectors[idx], n, &cur_bit_ofs);
			}
		}
	}

	assert(cur_bit_ofs == 128);
}